

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_get_table_cb(void *pArg,int nCol,char **argv,char **colv)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  iVar1 = *(int *)((long)pArg + 0x14);
  iVar4 = nCol << (argv != (char **)0x0 && iVar1 == 0);
  if (*(uint *)((long)pArg + 0x10) < (uint)(*(int *)((long)pArg + 0x1c) + iVar4)) {
    uVar7 = iVar4 + *(uint *)((long)pArg + 0x10) * 2;
    *(uint *)((long)pArg + 0x10) = uVar7;
    pvVar2 = sqlite3Realloc(*pArg,(ulong)uVar7 << 3);
    if (pvVar2 != (void *)0x0) {
      *(void **)pArg = pvVar2;
      iVar1 = *(int *)((long)pArg + 0x14);
      goto LAB_0011e48a;
    }
LAB_0011e544:
    *(undefined4 *)((long)pArg + 0x20) = 7;
LAB_0011e56f:
    iVar1 = 1;
  }
  else {
LAB_0011e48a:
    if (iVar1 == 0) {
      *(int *)((long)pArg + 0x18) = nCol;
      uVar6 = 0;
      if (0 < nCol) {
        uVar6 = (ulong)(uint)nCol;
      }
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pcVar3 = sqlite3_mprintf("%s",colv[uVar5]);
        if (pcVar3 == (char *)0x0) goto LAB_0011e544;
        uVar7 = *(uint *)((long)pArg + 0x1c);
        *(uint *)((long)pArg + 0x1c) = uVar7 + 1;
        *(char **)(*pArg + (ulong)uVar7 * 8) = pcVar3;
      }
    }
    else if (*(int *)((long)pArg + 0x18) != nCol) {
      sqlite3_free(*(void **)((long)pArg + 8));
      pcVar3 = sqlite3_mprintf("sqlite3_get_table() called with two or more incompatible queries");
      *(char **)((long)pArg + 8) = pcVar3;
      *(undefined4 *)((long)pArg + 0x20) = 1;
      goto LAB_0011e56f;
    }
    if (argv != (char **)0x0) {
      uVar5 = 0;
      uVar6 = (ulong)(uint)nCol;
      if (nCol < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (argv[uVar5] == (char *)0x0) {
          pvVar2 = (void *)0x0;
        }
        else {
          iVar1 = sqlite3Strlen30(argv[uVar5]);
          pvVar2 = sqlite3_malloc64((ulong)(iVar1 + 1));
          if (pvVar2 == (void *)0x0) goto LAB_0011e544;
          memcpy(pvVar2,argv[uVar5],(ulong)(iVar1 + 1));
        }
        uVar7 = *(uint *)((long)pArg + 0x1c);
        *(uint *)((long)pArg + 0x1c) = uVar7 + 1;
        *(void **)(*pArg + (ulong)uVar7 * 8) = pvVar2;
      }
      *(int *)((long)pArg + 0x14) = *(int *)((long)pArg + 0x14) + 1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int sqlite3_get_table_cb(void *pArg, int nCol, char **argv, char **colv){
  TabResult *p = (TabResult*)pArg;  /* Result accumulator */
  int need;                         /* Slots needed in p->azResult[] */
  int i;                            /* Loop counter */
  char *z;                          /* A single column of result */

  /* Make sure there is enough space in p->azResult to hold everything
  ** we need to remember from this invocation of the callback.
  */
  if( p->nRow==0 && argv!=0 ){
    need = nCol*2;
  }else{
    need = nCol;
  }
  if( p->nData + need > p->nAlloc ){
    char **azNew;
    p->nAlloc = p->nAlloc*2 + need;
    azNew = sqlite3Realloc( p->azResult, sizeof(char*)*p->nAlloc );
    if( azNew==0 ) goto malloc_failed;
    p->azResult = azNew;
  }

  /* If this is the first row, then generate an extra row containing
  ** the names of all columns.
  */
  if( p->nRow==0 ){
    p->nColumn = nCol;
    for(i=0; i<nCol; i++){
      z = sqlite3_mprintf("%s", colv[i]);
      if( z==0 ) goto malloc_failed;
      p->azResult[p->nData++] = z;
    }
  }else if( (int)p->nColumn!=nCol ){
    sqlite3_free(p->zErrMsg);
    p->zErrMsg = sqlite3_mprintf(
       "sqlite3_get_table() called with two or more incompatible queries"
    );
    p->rc = SQLITE_ERROR;
    return 1;
  }

  /* Copy over the row data
  */
  if( argv!=0 ){
    for(i=0; i<nCol; i++){
      if( argv[i]==0 ){
        z = 0;
      }else{
        int n = sqlite3Strlen30(argv[i])+1;
        z = sqlite3_malloc64( n );
        if( z==0 ) goto malloc_failed;
        memcpy(z, argv[i], n);
      }
      p->azResult[p->nData++] = z;
    }
    p->nRow++;
  }
  return 0;

malloc_failed:
  p->rc = SQLITE_NOMEM_BKPT;
  return 1;
}